

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdf.cpp
# Opt level: O3

void sdf_tools::exportSdf(module *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  is_new_style_constructor local_b9;
  class_<sdf_tools::sdf::SdfCapsule,_std::shared_ptr<sdf_tools::sdf::SdfCapsule>_> local_b8;
  arg local_b0;
  shared_class<Sdf> pysdf;
  arg local_98;
  float local_84;
  arg local_80;
  arg_v local_70;
  
  pybind11::class_<sdf_tools::sdf::Sdf,_std::shared_ptr<sdf_tools::sdf::Sdf>_>::class_<char[30]>
            ((class_<sdf_tools::sdf::Sdf,_std::shared_ptr<sdf_tools::sdf::Sdf>_> *)&pysdf,
             (m->super_object).super_handle.m_ptr,"Sdf",
             (char (*) [30])"\n        Base sdf class.\n    ");
  local_70.super_arg.name = (char *)0x11;
  local_70.super_arg._8_8_ = 0;
  local_80.name = "r";
  local_80._8_1_ = 2;
  pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>::
  def<float(sdf_tools::sdf::Sdf::*)(sdf_tools::real3)const,pybind11::arg,char[130]>
            ((class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>> *)&pysdf,"at",
             (offset_in_Grid_to_subr *)&local_70,&local_80,
             (char (*) [130])
             "\n        Evaluate the SDF field at the given position.\n\n        Args:\n            r: The position where to evaluate the SDF.\n    "
            );
  pybind11::class_<sdf_tools::sdf::SdfBox,std::shared_ptr<sdf_tools::sdf::SdfBox>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[36]>
            ((class_<sdf_tools::sdf::SdfBox,std::shared_ptr<sdf_tools::sdf::SdfBox>> *)&local_98,
             (m->super_object).super_handle.m_ptr,"Box",&pysdf,
             (char (*) [36])"\n        Box aligned with axes\n    ");
  local_70.super_arg.name = "low";
  local_70.super_arg._8_1_ = 2;
  local_80.name = "high";
  local_80._8_1_ = 2;
  local_b0.name = "inside";
  local_b0._8_1_ = 2;
  pybind11::class_<sdf_tools::sdf::SdfBox,_std::shared_ptr<sdf_tools::sdf::SdfBox>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[198]>
            ((class_<sdf_tools::sdf::SdfBox,_std::shared_ptr<sdf_tools::sdf::SdfBox>_> *)&local_98,
             "__init__",(type *)&local_b8,(is_new_style_constructor *)&local_84,&local_70.super_arg,
             &local_80,&local_b0,
             (char (*) [198])
             "\n\n            Args:\n                low: Lower corner of the box.\n                high: Upper corner of the box.\n                inside: ``True`` if the interior is inside the given shape.\n        "
            );
  pybind11::object::~object((object *)&local_98);
  pybind11::class_<sdf_tools::sdf::SdfCapsule,std::shared_ptr<sdf_tools::sdf::SdfCapsule>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[58]>
            ((class_<sdf_tools::sdf::SdfCapsule,std::shared_ptr<sdf_tools::sdf::SdfCapsule>> *)
             &local_b8,(m->super_object).super_handle.m_ptr,"Capsule",&pysdf,
             (char (*) [58])"\n        Capsule defined by a segment and a radius.\n\n    ");
  local_70.super_arg.name = "start";
  local_70.super_arg._8_1_ = 2;
  local_80.name = "end";
  local_80._8_1_ = 2;
  local_b0.name = "radius";
  local_b0._8_1_ = 2;
  local_98.name = "inside";
  local_98._8_1_ = 2;
  pybind11::class_<sdf_tools::sdf::SdfCapsule,_std::shared_ptr<sdf_tools::sdf::SdfCapsule>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[257]>
            (&local_b8,"__init__",(type *)&local_84,&local_b9,&local_70.super_arg,&local_80,
             &local_b0,&local_98,
             (char (*) [257])
             "\n\n            Args:\n                start: First end of the segment.\n                end:  Second end of the segment.\n                radius: Radius of the capsule.\n                inside: Whether the domain is inside the capsule or outside of it.\n        "
            );
  pybind11::object::~object((object *)&local_b8);
  pybind11::class_<sdf_tools::sdf::SdfEdges,std::shared_ptr<sdf_tools::sdf::SdfEdges>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[65]>
            ((class_<sdf_tools::sdf::SdfEdges,std::shared_ptr<sdf_tools::sdf::SdfEdges>> *)&local_b8
             ,(m->super_object).super_handle.m_ptr,"Edges",&pysdf,
             (char (*) [65])"\n        Closed polygon defined from edges in the xy plane.\n    ");
  local_b0.name = "edges";
  local_b0._8_1_ = 2;
  local_98.name = "inside";
  local_98._8_1_ = 2;
  local_84 = 2.8026e-44;
  local_80.name = "nsamples";
  local_80._8_1_ = 2;
  pybind11::arg_v::arg_v<int>(&local_70,&local_80,(int *)&local_84,(char *)0x0);
  pybind11::class_<sdf_tools::sdf::SdfEdges,_std::shared_ptr<sdf_tools::sdf::SdfEdges>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_char[258]>
            ((class_<sdf_tools::sdf::SdfEdges,_std::shared_ptr<sdf_tools::sdf::SdfEdges>_> *)
             &local_b8,"__init__",(type *)&local_80,&local_b9,&local_b0,&local_98,&local_70,
             (char (*) [258])
             "\n\n            Args:\n                edges: List of vertices positions (2D).\n                inside: ``True`` if the interior is inside the given shape.\n                nsamples: Number of samples to find the sign of the SDF (more is more accurate).\n        "
            );
  paVar1 = &local_70.type.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.type._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.type._M_dataplus._M_p,local_70.type.field_2._M_allocated_capacity + 1);
  }
  pybind11::object::~object(&local_70.value);
  pybind11::object::~object((object *)&local_b8);
  pybind11::class_<sdf_tools::sdf::SdfFromMesh,std::shared_ptr<sdf_tools::sdf::SdfFromMesh>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[36]>
            ((class_<sdf_tools::sdf::SdfFromMesh,std::shared_ptr<sdf_tools::sdf::SdfFromMesh>> *)
             &local_98,(m->super_object).super_handle.m_ptr,"FromMesh",&pysdf,
             (char (*) [36])"\n        Closed triangle mesh.\n    ");
  local_70.super_arg.name = "faces";
  local_70.super_arg._8_1_ = 2;
  local_80.name = "vertices";
  local_80._8_1_ = 2;
  local_b0.name = "inside";
  local_b0._8_1_ = 2;
  pybind11::class_<sdf_tools::sdf::SdfFromMesh,_std::shared_ptr<sdf_tools::sdf::SdfFromMesh>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[229]>
            ((class_<sdf_tools::sdf::SdfFromMesh,_std::shared_ptr<sdf_tools::sdf::SdfFromMesh>_> *)
             &local_98,"__init__",(type *)&local_b8,(is_new_style_constructor *)&local_84,
             &local_70.super_arg,&local_80,&local_b0,
             (char (*) [229])
             "\n\n            Args:\n                faces: List of vertex indices forming each face.\n                vertices: List of vertices positions (3D).\n                inside: ``True`` if the interior is inside the given shape.\n        "
            );
  pybind11::object::~object((object *)&local_98);
  pybind11::
  class_<sdf_tools::sdf::SdfPiecewisePipe,std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[109]>
            ((class_<sdf_tools::sdf::SdfPiecewisePipe,std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>>
              *)&local_98,(m->super_object).super_handle.m_ptr,"PiecewisePipe",&pysdf,
             (char (*) [109])
             "\n        The union of many connected capsules, forming a piecewise linear pipe with a constant radius.\n\n    "
            );
  local_70.super_arg.name = "vertices";
  local_70.super_arg._8_1_ = 2;
  local_80.name = "radius";
  local_80._8_1_ = 2;
  local_b0.name = "inside";
  local_b0._8_1_ = 2;
  pybind11::
  class_<sdf_tools::sdf::SdfPiecewisePipe,_std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[236]>
            ((class_<sdf_tools::sdf::SdfPiecewisePipe,_std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>_>
              *)&local_98,"__init__",(type *)&local_b8,(is_new_style_constructor *)&local_84,
             &local_70.super_arg,&local_80,&local_b0,
             (char (*) [236])
             "\n\n            Args:\n                vertices: Coordinates of the points forming the center line.\n                radius: Radius of the capsule.\n                inside: Whether the domain is inside the capsule or outside of it.\n        "
            );
  pybind11::object::~object((object *)&local_98);
  pybind11::class_<sdf_tools::sdf::SdfPlate,std::shared_ptr<sdf_tools::sdf::SdfPlate>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[97]>
            ((class_<sdf_tools::sdf::SdfPlate,std::shared_ptr<sdf_tools::sdf::SdfPlate>> *)&local_b0
             ,(m->super_object).super_handle.m_ptr,"Plate",&pysdf,
             (char (*) [97])
             "\n        Plate defined by one point on the surface and the normal vector, pointing inside.\n\n    "
            );
  local_70.super_arg.name = "point";
  local_70.super_arg._8_1_ = 2;
  local_80.name = "normal";
  local_80._8_1_ = 2;
  pybind11::class_<sdf_tools::sdf::SdfPlate,_std::shared_ptr<sdf_tools::sdf::SdfPlate>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_char[209]>
            ((class_<sdf_tools::sdf::SdfPlate,_std::shared_ptr<sdf_tools::sdf::SdfPlate>_> *)
             &local_b0,"__init__",(type *)&local_98,(is_new_style_constructor *)&local_b8,
             &local_70.super_arg,&local_80,
             (char (*) [209])
             "\n            Args:\n                point: One point on the plane.\n                normal: The normal vector (not necessarily normalized, but must be non-zero)\n                        pointing inside.\n        "
            );
  pybind11::object::~object((object *)&local_b0);
  pybind11::class_<sdf_tools::sdf::SdfSphere,std::shared_ptr<sdf_tools::sdf::SdfSphere>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[56]>
            ((class_<sdf_tools::sdf::SdfSphere,std::shared_ptr<sdf_tools::sdf::SdfSphere>> *)
             &local_98,(m->super_object).super_handle.m_ptr,"Sphere",&pysdf,
             (char (*) [56])"\n        Sphere defined by its center and radius.\n\n    ");
  local_70.super_arg.name = "center";
  local_70.super_arg._8_1_ = 2;
  local_80.name = "radius";
  local_80._8_1_ = 2;
  local_b0.name = "inside";
  local_b0._8_1_ = 2;
  pybind11::class_<sdf_tools::sdf::SdfSphere,_std::shared_ptr<sdf_tools::sdf::SdfSphere>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[203]>
            ((class_<sdf_tools::sdf::SdfSphere,_std::shared_ptr<sdf_tools::sdf::SdfSphere>_> *)
             &local_98,"__init__",(type *)&local_b8,(is_new_style_constructor *)&local_84,
             &local_70.super_arg,&local_80,&local_b0,
             (char (*) [203])
             "\n\n            Args:\n                center: Center of the sphere.\n                radius: Radius of the sphere.\n                inside: Whether the domain is inside the sphere or outside of it.\n        "
            );
  pybind11::object::~object((object *)&local_98);
  pybind11::class_<sdf_tools::sdf::SdfUnion,std::shared_ptr<sdf_tools::sdf::SdfUnion>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[31]>
            ((class_<sdf_tools::sdf::SdfUnion,std::shared_ptr<sdf_tools::sdf::SdfUnion>> *)&local_b0
             ,(m->super_object).super_handle.m_ptr,"Union",&pysdf,(char (*) [31])0x13e563);
  local_70.super_arg.name = "a";
  local_70.super_arg._8_1_ = 2;
  local_80.name = "b";
  local_80._8_1_ = 2;
  pybind11::class_<sdf_tools::sdf::SdfUnion,_std::shared_ptr<sdf_tools::sdf::SdfUnion>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_char[87]>
            ((class_<sdf_tools::sdf::SdfUnion,_std::shared_ptr<sdf_tools::sdf::SdfUnion>_> *)
             &local_b0,"__init__",(type *)&local_98,(is_new_style_constructor *)&local_b8,
             &local_70.super_arg,&local_80,
             (char (*) [87])
             "\n\n        Args:\n            a: The first sdf.\n            b: The second sdf.\n\n        "
            );
  pybind11::object::~object((object *)&local_b0);
  pybind11::class_<sdf_tools::sdf::SdfIntersection,std::shared_ptr<sdf_tools::sdf::SdfIntersection>>
  ::class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[38]>
            ((class_<sdf_tools::sdf::SdfIntersection,std::shared_ptr<sdf_tools::sdf::SdfIntersection>>
              *)&local_b0,(m->super_object).super_handle.m_ptr,"Intersection",&pysdf,
             (char (*) [38])"Intersection between two SDF objects.");
  local_70.super_arg.name = "a";
  local_70.super_arg._8_1_ = 2;
  local_80.name = "b";
  local_80._8_1_ = 2;
  pybind11::
  class_<sdf_tools::sdf::SdfIntersection,_std::shared_ptr<sdf_tools::sdf::SdfIntersection>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_char[87]>
            ((class_<sdf_tools::sdf::SdfIntersection,_std::shared_ptr<sdf_tools::sdf::SdfIntersection>_>
              *)&local_b0,"__init__",(type *)&local_98,(is_new_style_constructor *)&local_b8,
             &local_70.super_arg,&local_80,
             (char (*) [87])
             "\n\n        Args:\n            a: The first sdf.\n            b: The second sdf.\n\n        "
            );
  pybind11::object::~object((object *)&local_b0);
  pybind11::class_<sdf_tools::sdf::SdfDifference,std::shared_ptr<sdf_tools::sdf::SdfDifference>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[36]>
            ((class_<sdf_tools::sdf::SdfDifference,std::shared_ptr<sdf_tools::sdf::SdfDifference>> *
             )&local_b0,(m->super_object).super_handle.m_ptr,"Difference",&pysdf,
             (char (*) [36])"Difference between two SDF objects.");
  local_70.super_arg.name = "a";
  local_70.super_arg._8_1_ = 2;
  local_80.name = "b";
  local_80._8_1_ = 2;
  pybind11::class_<sdf_tools::sdf::SdfDifference,_std::shared_ptr<sdf_tools::sdf::SdfDifference>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_char[138]>
            ((class_<sdf_tools::sdf::SdfDifference,_std::shared_ptr<sdf_tools::sdf::SdfDifference>_>
              *)&local_b0,"__init__",(type *)&local_98,(is_new_style_constructor *)&local_b8,
             &local_70.super_arg,&local_80,
             (char (*) [138])
             "\n\n        Args:\n            a: The original sdf.\n            b: The sdf of the object that should be removed from the original.\n\n        "
            );
  pybind11::object::~object((object *)&local_b0);
  pybind11::class_<sdf_tools::sdf::SdfSmoothUnion,std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[38]>
            ((class_<sdf_tools::sdf::SdfSmoothUnion,std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>>
              *)&local_b8,(m->super_object).super_handle.m_ptr,"SmoothUnion",&pysdf,
             (char (*) [38])"Smooth Union between two SDF objects.");
  local_b0.name = "a";
  local_b0._8_1_ = 2;
  local_98.name = "b";
  local_98._8_1_ = 2;
  local_84 = 32.0;
  local_80.name = "k";
  local_80._8_1_ = 2;
  pybind11::arg_v::arg_v<float>(&local_70,&local_80,&local_84,(char *)0x0);
  pybind11::class_<sdf_tools::sdf::SdfSmoothUnion,_std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_char[144]>
            ((class_<sdf_tools::sdf::SdfSmoothUnion,_std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>_>
              *)&local_b8,"__init__",(type *)&local_80,&local_b9,&local_b0,&local_98,&local_70,
             (char (*) [144])
             "\n\n        Args:\n            a: The first sdf.\n            b: The second sdf.\n            k: The smoothing parameter. Must be positive.\n        "
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.type._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.type._M_dataplus._M_p,local_70.type.field_2._M_allocated_capacity + 1);
  }
  pybind11::object::~object(&local_70.value);
  pybind11::object::~object((object *)&local_b8);
  pybind11::class_<sdf_tools::sdf::SdfComplement,std::shared_ptr<sdf_tools::sdf::SdfComplement>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[31]>
            ((class_<sdf_tools::sdf::SdfComplement,std::shared_ptr<sdf_tools::sdf::SdfComplement>> *
             )&local_80,(m->super_object).super_handle.m_ptr,"Complement",&pysdf,
             (char (*) [31])"Reverse interior and exterior.");
  local_70.super_arg.name = "sdf";
  local_70.super_arg._8_1_ = 2;
  pybind11::class_<sdf_tools::sdf::SdfComplement,_std::shared_ptr<sdf_tools::sdf::SdfComplement>_>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_char[61]>
            ((class_<sdf_tools::sdf::SdfComplement,_std::shared_ptr<sdf_tools::sdf::SdfComplement>_>
              *)&local_80,"__init__",(type *)&local_b0,(is_new_style_constructor *)&local_98,
             &local_70.super_arg,
             (char (*) [61])"\n\n        Args:\n            sdf: The original sdf.\n\n        ");
  pybind11::object::~object((object *)&local_80);
  pybind11::object::~object((object *)&pysdf);
  return;
}

Assistant:

void exportSdf(py::module& m)
{
    py::shared_class<Sdf> pysdf(m, "Sdf", R"(
        Base sdf class.
    )");

    pysdf.def("at", &Sdf::at,
              "r"_a, R"(
        Evaluate the SDF field at the given position.

        Args:
            r: The position where to evaluate the SDF.
    )");

    py::shared_class<SdfBox> (m, "Box", pysdf, R"(
        Box aligned with axes
    )")
        .def(py::init <real3, real3, bool> (),
             "low"_a, "high"_a, "inside"_a, R"(

            Args:
                low: Lower corner of the box.
                high: Upper corner of the box.
                inside: ``True`` if the interior is inside the given shape.
        )");

    py::shared_class<SdfCapsule> (m, "Capsule", pysdf, R"(
        Capsule defined by a segment and a radius.

    )")
        .def(py::init <real3, real3, real, bool> (),
             "start"_a, "end"_a, "radius"_a, "inside"_a, R"(

            Args:
                start: First end of the segment.
                end:  Second end of the segment.
                radius: Radius of the capsule.
                inside: Whether the domain is inside the capsule or outside of it.
        )");

    py::shared_class<SdfEdges> (m, "Edges", pysdf, R"(
        Closed polygon defined from edges in the xy plane.
    )")
        .def(py::init <std::vector<real2>&, bool, int> (),
             "edges"_a, "inside"_a, "nsamples"_a = 20, R"(

            Args:
                edges: List of vertices positions (2D).
                inside: ``True`` if the interior is inside the given shape.
                nsamples: Number of samples to find the sign of the SDF (more is more accurate).
        )");

    py::shared_class<SdfFromMesh> (m, "FromMesh", pysdf, R"(
        Closed triangle mesh.
    )")
        .def(py::init <std::vector<int3>, std::vector<real3>, bool> (),
             "faces"_a, "vertices"_a, "inside"_a, R"(

            Args:
                faces: List of vertex indices forming each face.
                vertices: List of vertices positions (3D).
                inside: ``True`` if the interior is inside the given shape.
        )");

    py::shared_class<SdfPiecewisePipe> (m, "PiecewisePipe", pysdf, R"(
        The union of many connected capsules, forming a piecewise linear pipe with a constant radius.

    )")
        .def(py::init <std::vector<real3>, real, bool> (),
             "vertices"_a, "radius"_a, "inside"_a, R"(

            Args:
                vertices: Coordinates of the points forming the center line.
                radius: Radius of the capsule.
                inside: Whether the domain is inside the capsule or outside of it.
        )");

    py::shared_class<SdfPlate> (m, "Plate", pysdf, R"(
        Plate defined by one point on the surface and the normal vector, pointing inside.

    )")
        .def(py::init <real3, real3> (),
             "point"_a, "normal"_a, R"(
            Args:
                point: One point on the plane.
                normal: The normal vector (not necessarily normalized, but must be non-zero)
                        pointing inside.
        )");

    py::shared_class<SdfSphere> (m, "Sphere", pysdf, R"(
        Sphere defined by its center and radius.

    )")
        .def(py::init <real3, real, bool> (),
             "center"_a, "radius"_a, "inside"_a, R"(

            Args:
                center: Center of the sphere.
                radius: Radius of the sphere.
                inside: Whether the domain is inside the sphere or outside of it.
        )");


    py::shared_class<SdfUnion> (m, "Union", pysdf, "Union between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>>(),
             "a"_a, "b"_a, R"(

        Args:
            a: The first sdf.
            b: The second sdf.

        )");

    py::shared_class<SdfIntersection> (m, "Intersection", pysdf, "Intersection between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>>(),
            "a"_a, "b"_a, R"(

        Args:
            a: The first sdf.
            b: The second sdf.

        )");

    py::shared_class<SdfDifference> (m, "Difference", pysdf, "Difference between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>>(),
            "a"_a, "b"_a, R"(

        Args:
            a: The original sdf.
            b: The sdf of the object that should be removed from the original.

        )");

    py::shared_class<SdfSmoothUnion> (m, "SmoothUnion", pysdf, "Smooth Union between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>, real>(),
             "a"_a, "b"_a, "k"_a=32.0_r, R"(

        Args:
            a: The first sdf.
            b: The second sdf.
            k: The smoothing parameter. Must be positive.
        )");

    py::shared_class<SdfComplement> (m, "Complement", pysdf, "Reverse interior and exterior.")
        .def(py::init<std::shared_ptr<Sdf>>(),
            "sdf"_a, R"(

        Args:
            sdf: The original sdf.

        )");

}